

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall wasm::OptimizeInstructions::visitRefAs(OptimizeInstructions *this,RefAs *curr)

{
  bool bVar1;
  HeapType heapType;
  Type local_38;
  RefCast *local_30;
  RefCast *cast;
  RefAs *refAsChild;
  RefAs *local_18;
  RefAs *curr_local;
  OptimizeInstructions *this_local;
  
  refAsChild._4_4_ = 1;
  local_18 = curr;
  curr_local = (RefAs *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression.
                      type,(BasicType *)((long)&refAsChild + 4));
  if (!bVar1) {
    if ((local_18->op == ExternConvertAny) || (local_18->op == AnyConvertExtern)) {
      cast = (RefCast *)Expression::dynCast<wasm::RefAs>(local_18->value);
      if ((RefAs *)cast != (RefAs *)0x0) {
        if (((RefAs *)cast)->op == RefAsNonNull) {
          local_18->value = ((RefAs *)cast)->value;
          RefAs::finalize(local_18);
          *(RefAs **)&cast[1].super_SpecificExpression<(wasm::Expression::Id)63>.super_Expression =
               local_18;
          RefAs::finalize((RefAs *)cast);
          replaceCurrent(this,(Expression *)cast);
        }
        else if (((local_18->op == ExternConvertAny) && (((RefAs *)cast)->op == AnyConvertExtern))
                || ((local_18->op == AnyConvertExtern && (((RefAs *)cast)->op == ExternConvertAny)))
                ) {
          replaceCurrent(this,((RefAs *)cast)->value);
        }
      }
    }
    else {
      if (local_18->op != RefAsNonNull) {
        __assert_fail("curr->op == RefAsNonNull",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x9ef,"void wasm::OptimizeInstructions::visitRefAs(RefAs *)");
      }
      bVar1 = trapOnNull(this,(Expression *)local_18,&local_18->value);
      if (!bVar1) {
        skipNonNullCast(this,&local_18->value,(Expression *)local_18);
        bVar1 = wasm::Type::isNullable(&local_18->value->type);
        if (bVar1) {
          local_30 = Expression::dynCast<wasm::RefCast>(local_18->value);
          if (local_30 != (RefCast *)0x0) {
            bVar1 = wasm::Type::isNonNullable
                              (&(local_30->super_SpecificExpression<(wasm::Expression::Id)63>).
                                super_Expression.type);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              __assert_fail("!cast->type.isNonNullable()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                            ,0xa03,"void wasm::OptimizeInstructions::visitRefAs(RefAs *)");
            }
            heapType = wasm::Type::getHeapType
                                 (&(local_30->super_SpecificExpression<(wasm::Expression::Id)63>).
                                   super_Expression.type);
            wasm::Type::Type(&local_38,heapType,NonNullable,Inexact);
            (local_30->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id
                 = local_38.id;
            replaceCurrent(this,(Expression *)local_30);
          }
        }
        else {
          replaceCurrent(this,local_18->value);
        }
      }
    }
  }
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    if (curr->op == ExternConvertAny || curr->op == AnyConvertExtern) {
      // These pass nulls through, and we can reorder them with null traps:
      //
      //  (any.convert_extern/extern.convert_any (ref.as_non_null.. ))
      // =>
      //  (ref.as_non_null (any.convert_extern/extern.convert_any ..))
      //
      // By moving the RefAsNonNull outside, it may reach a position where it
      // can be optimized (e.g. if the parent traps anyhow). And,
      // ExternConvertAny/AnyConvertExtern cannot be folded with anything, so
      // there is no harm to moving them inside.
      if (auto* refAsChild = curr->value->dynCast<RefAs>()) {
        if (refAsChild->op == RefAsNonNull) {
          // Reorder and fix up the types.
          curr->value = refAsChild->value;
          curr->finalize();
          refAsChild->value = curr;
          refAsChild->finalize();
          replaceCurrent(refAsChild);
          return;
        }

        // We can optimize away externalizations of internalizations and vice
        // versa.
        if ((curr->op == ExternConvertAny &&
             refAsChild->op == AnyConvertExtern) ||
            (curr->op == AnyConvertExtern &&
             refAsChild->op == ExternConvertAny)) {
          replaceCurrent(refAsChild->value);
          return;
        }
      }
      return;
    }

    assert(curr->op == RefAsNonNull);
    if (trapOnNull(curr, curr->value)) {
      return;
    }
    skipNonNullCast(curr->value, curr);
    if (!curr->value->type.isNullable()) {
      replaceCurrent(curr->value);
      return;
    }

    // As we do in visitRefCast, ref.cast can be combined with ref.as_non_null.
    // This code handles the case where the ref.as is on the outside:
    //
    //   (ref.as_non_null (ref.cast null ..))
    // =>
    //   (ref.cast ..)
    //
    if (auto* cast = curr->value->dynCast<RefCast>()) {
      // The cast cannot be non-nullable, or we would have handled this right
      // above by just removing the ref.as, since it would not be needed.
      assert(!cast->type.isNonNullable());
      cast->type = Type(cast->type.getHeapType(), NonNullable);
      replaceCurrent(cast);
    }
  }